

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O3

void __thiscall wasm::InstrumentMemory::visitArraySet(InstrumentMemory *this,ArraySet *curr)

{
  Index IVar1;
  uintptr_t uVar2;
  size_t sVar3;
  char *pcVar4;
  Call *pCVar5;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  Const *local_60;
  Expression *local_58;
  Builder local_50;
  Builder builder;
  pointer local_38;
  allocator_type local_29;
  
  pcVar4 = _ZN4wasmL15array_set_indexE_1;
  sVar3 = _ZN4wasmL15array_set_indexE_0;
  local_50.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  IVar1 = this->id;
  this->id = IVar1 + 1;
  local_60 = Builder::makeConst<int>(&local_50,IVar1);
  local_58 = curr->index;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l,
             &local_29);
  target.super_IString.str._M_str = pcVar4;
  target.super_IString.str._M_len = sVar3;
  pCVar5 = Builder::makeCall(&local_50,target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &builder,(Type)0x2,false);
  curr->index = (Expression *)pCVar5;
  if (builder.wasm != (Module *)0x0) {
    operator_delete(builder.wasm,(long)local_38 - (long)builder.wasm);
  }
  uVar2 = (curr->value->type).id;
  if (uVar2 - 2 < 4) {
    sVar3 = *(size_t *)(&PTR_DAT_010731d0)[uVar2];
    pcVar4 = *(char **)(&PTR_array_get_val_f32_010731b0)[uVar2];
    IVar1 = this->id;
    this->id = IVar1 + 1;
    local_60 = Builder::makeConst<int>(&local_50,IVar1);
    local_58 = curr->value;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_60;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l_00,
               &local_29);
    target_00.super_IString.str._M_str = pcVar4;
    target_00.super_IString.str._M_len = sVar3;
    pCVar5 = Builder::makeCall(&local_50,target_00,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &builder,(Type)(curr->value->type).id,false);
    curr->value = (Expression *)pCVar5;
    if (builder.wasm != (Module *)0x0) {
      operator_delete(builder.wasm,(long)local_38 - (long)builder.wasm);
    }
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    Builder builder(*getModule());
    curr->index =
      builder.makeCall(array_set_index,
                       {builder.makeConst(int32_t(id++)), curr->index},
                       Type::i32);
    Name target;
    if (curr->value->type == Type::i32) {
      target = array_set_val_i32;
    } else if (curr->value->type == Type::i64) {
      target = array_set_val_i64;
    } else if (curr->value->type == Type::f32) {
      target = array_set_val_f32;
    } else if (curr->value->type == Type::f64) {
      target = array_set_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    curr->value =
      builder.makeCall(target,
                       {builder.makeConst(int32_t(id++)), curr->value},
                       curr->value->type);
  }